

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

int Gia_ManSuppSizeTest(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Gia_Obj_t *pObj;
  abctime aVar4;
  abctime time;
  uint uVar5;
  int v;
  char *pStr;
  
  uVar5 = 0;
  aVar3 = Abc_Clock();
  for (v = 0; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar1 = Gia_ManSuppSizeOne(p,pObj);
      uVar5 = uVar5 + (iVar1 < 0x11);
    }
  }
  uVar2 = Gia_ManAndNum(p);
  pStr = (char *)(ulong)uVar5;
  printf("Nodes with small support %d (out of %d)\n",pStr,(ulong)uVar2);
  aVar4 = Abc_Clock();
  Abc_PrintTime((int)aVar4 - (int)aVar3,pStr,time);
  return uVar5;
}

Assistant:

int Gia_ManSuppSizeTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            Counter += (Gia_ManSuppSizeOne(p, pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Gia_ManAndNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}